

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O2

bool __thiscall
Clasp::Cli::ClaspCliConfig::setConfig
          (ClaspCliConfig *this,ConfigIter *config,uint8 mode,uint32 sId,ParsedOpts *exclude,
          ParsedOpts *out)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ConfigKey baseK;
  ConfigIter *local_40;
  ConfigIter base;
  
  pcVar2 = ConfigIter::base(config);
  if (*pcVar2 != '\0') {
    baseK = config_default;
    local_40 = config;
    pcVar2 = ConfigIter::base(config);
    bVar1 = Potassco::string_cast<Clasp::Cli::ConfigKey>(pcVar2,&baseK);
    if (!bVar1) {
      pcVar2 = local_40->base_;
      pcVar3 = ConfigIter::base(local_40);
      Potassco::fail(-2,
                     "bool Clasp::Cli::ClaspCliConfig::setConfig(const ConfigIter &, uint8, uint32, const ParsedOpts &, ParsedOpts *)"
                     ,0x457,"Potassco::stringTo(config.base(), baseK)",
                     "%s: \'%s\': Invalid base config!",pcVar2 + 1,pcVar3,0);
    }
    base = getConfig(baseK);
    pcVar2 = base.base_ + 1;
    pcVar3 = ConfigIter::args(&base);
    setConfig(this,pcVar2,pcVar3,mode | 1,sId,exclude,out);
    config = local_40;
  }
  pcVar2 = config->base_;
  pcVar3 = ConfigIter::args(config);
  setConfig(this,pcVar2 + 1,pcVar3,mode,sId,exclude,out);
  return true;
}

Assistant:

bool ClaspCliConfig::setConfig(const ConfigIter& config, uint8 mode, uint32 sId, const ParsedOpts& exclude, ParsedOpts* out) {
	if (*config.base()) {
		ConfigKey baseK = config_default;
		POTASSCO_REQUIRE(Potassco::stringTo(config.base(), baseK), "%s: '%s': Invalid base config!", config.name(), config.base());
		ConfigIter base = getConfig(baseK);
		if (!setConfig(base.name(), base.args(), mode | mode_solver, sId, exclude, out)) {
			return false;
		}
	}
	return setConfig(config.name(), config.args(), mode, sId, exclude, out);
}